

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O3

void __thiscall libtorrent::http_stream::handshake2(http_stream *this,error_code *e,handler_type *h)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer pcVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  transfer_all_t local_79;
  undefined1 local_78 [8];
  error_category *local_70;
  _Any_data _Stack_68;
  _Manager_type p_Stack_58;
  _Invoker_type local_50;
  _Head_base<0UL,_libtorrent::http_stream_*,_false> local_48;
  mutable_buffers_1 local_40;
  http_stream *local_30;
  
  bVar4 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (bVar4) {
    return;
  }
  this_00 = &this->m_buffer;
  pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  if (((2 < uVar7) && (pcVar1[uVar7 - 1] == '\n')) &&
     ((pcVar1[uVar7 - 2] == '\n' ||
      (((pcVar1[uVar7 - 2] == '\r' && 4 < uVar7 && (pcVar1[uVar7 - 3] == '\n')) &&
       (pcVar1[uVar7 - 4] == '\r')))))) {
    local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,local_78);
    pcVar6 = strchr((this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start,0x20);
    if ((pcVar6 == (char *)0x0) || (iVar5 = atoi(pcVar6 + 1), iVar5 != 200)) {
      local_78 = (undefined1  [8])0x10000005f;
      local_70 = &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
      if ((h->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*h->_M_invoker)((_Any_data *)h,(error_code *)local_78);
        local_78 = (undefined1  [8])((ulong)local_78 & 0xffffff0000000000);
        local_70 = &boost::system::detail::cat_holder<void>::system_category_instance.
                    super_error_category;
        close(this,(int)local_78);
        return;
      }
    }
    else if ((h->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*h->_M_invoker)((_Any_data *)h,e);
      pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pcVar1 != (pointer)0x0) {
        operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
        return;
      }
      return;
    }
    std::__throw_bad_function_call();
  }
  std::vector<char,_std::allocator<char>_>::resize(this_00,uVar7 + 1);
  local_40.super_mutable_buffer.data_ =
       (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start + uVar7;
  local_40.super_mutable_buffer.size_ = 1;
  local_78 = (undefined1  [8])handshake2;
  local_70 = (error_category *)0x0;
  _Stack_68._M_unused._M_object = (void *)0x0;
  _Stack_68._8_8_ = 0;
  p_Stack_58 = (_Manager_type)0x0;
  local_50 = h->_M_invoker;
  p_Var3 = (h->super__Function_base)._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    _Stack_68._M_unused._0_8_ = (undefined8)*(undefined8 *)&(h->super__Function_base)._M_functor;
    _Stack_68._8_8_ = *(undefined8 *)((long)&(h->super__Function_base)._M_functor + 8);
    (h->super__Function_base)._M_manager = (_Manager_type)0x0;
    h->_M_invoker = (_Invoker_type)0x0;
    p_Stack_58 = p_Var3;
  }
  local_48._M_head_impl = this;
  local_30 = this;
  boost::asio::detail::
  initiate_async_read_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::operator()((initiate_async_read_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                *)&local_30,
               (_Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
                *)local_78,&local_40,&local_79);
  if (p_Stack_58 != (_Manager_type)0x0) {
    (*p_Stack_58)(&_Stack_68,&_Stack_68,__destroy_functor);
    return;
  }
  return;
}

Assistant:

void http_stream::handshake2(error_code const& e, handler_type& h)
	{
		if (handle_error(e, h)) return;

		std::size_t const read_pos = m_buffer.size();
		// look for \n\n and \r\n\r\n
		// both of which means end of http response header
		bool found_end = false;
		if (read_pos > 2 && m_buffer[read_pos - 1] == '\n')
		{
			if (m_buffer[read_pos - 2] == '\n')
			{
				found_end = true;
			}
			else if (read_pos > 4
				&& m_buffer[read_pos - 2] == '\r'
				&& m_buffer[read_pos - 3] == '\n'
				&& m_buffer[read_pos - 4] == '\r')
			{
				found_end = true;
			}
		}

		if (found_end)
		{
			m_buffer.push_back(0);
			char const* status = std::strchr(m_buffer.data(), ' ');
			if (status == nullptr)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			status++;
			int const code = std::atoi(status);
			if (code != 200)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		// read another byte from the socket
		m_buffer.resize(read_pos + 1);
		async_read(m_sock, boost::asio::buffer(m_buffer.data() + read_pos, 1)
			, std::bind(&http_stream::handshake2, this, _1, std::move(h)));
	}